

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  UInt32 UVar9;
  uint uVar10;
  int iVar11;
  UInt32 *pUVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  UInt32 (*paUVar17) [64];
  UInt32 *pUVar18;
  int aiStack_228 [126];
  
  lVar7 = 4;
  do {
    bVar1 = p->g_FastPos[lVar7];
    iVar5 = (bVar1 >> 1) - 1;
    bVar2 = (byte)iVar5 & 0x1f;
    uVar10 = (bVar1 & 1 | 2) << bVar2;
    if (iVar5 == 0) {
      iVar11 = 0;
    }
    else {
      uVar13 = (int)lVar7 - uVar10;
      iVar11 = 0 << bVar2;
      uVar14 = 1;
      do {
        uVar15 = uVar13 & 1;
        uVar8 = (ulong)uVar14;
        uVar14 = uVar15 + uVar14 * 2;
        uVar13 = uVar13 >> 1;
        iVar11 = iVar11 + p->ProbPrices
                          [(-uVar15 & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)p +
                                  uVar8 * 2 +
                                  ((ulong)uVar10 * 2 - (ulong)((uint)bVar1 * 2)) + 0x341b2)) >> 4];
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    aiStack_228[lVar7 + -4] = iVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x80);
  uVar10 = p->distTableSize;
  uVar8 = (ulong)uVar10;
  pUVar12 = p->posSlotPrices[0] + 0xe;
  lVar16 = 0;
  lVar7 = 0;
  do {
    paUVar17 = p->posSlotPrices + lVar7;
    if (uVar8 != 0) {
      uVar6 = 0;
      do {
        UVar9 = 0;
        uVar14 = (uint)uVar6 | 0x40;
        do {
          uVar13 = uVar14 >> 1;
          UVar9 = UVar9 + p->ProbPrices
                          [(-(uVar14 & 1) & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)p->posSlotEncoder[lVar7] + (ulong)(uVar14 & 0xfffffffe)))
                           >> 4];
          uVar14 = uVar13;
        } while (uVar13 != 1);
        (*paUVar17)[uVar6] = UVar9;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar8);
    }
    if (0xe < uVar10) {
      lVar4 = 0x70;
      pUVar18 = pUVar12;
      do {
        *pUVar18 = (((uint)lVar4 & 0xfffffff0) + *pUVar18) - 0x50;
        pUVar18 = pUVar18 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar8 * 8 - lVar4 != 0);
    }
    uVar3 = *(undefined8 *)(*paUVar17 + 2);
    *(undefined8 *)p->distancesPrices[lVar7] = *(undefined8 *)*paUVar17;
    *(undefined8 *)(p->distancesPrices[lVar7] + 2) = uVar3;
    lVar4 = 0;
    do {
      *(UInt32 *)((long)p->distancesPrices[0] + lVar4 * 4 + lVar16 + 0x10) =
           aiStack_228[lVar4] + (*paUVar17)[p->g_FastPos[lVar4 + 4]];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x7c);
    lVar7 = lVar7 + 1;
    pUVar12 = pUVar12 + 0x40;
    lVar16 = lVar16 + 0x200;
  } while (lVar7 != 4);
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc *p)
{
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++)
  {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++)
  {
    UInt32 posSlot;
    const CLzmaProb *encoder = p->posSlotEncoder[lenToPosState];
    UInt32 *posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32 *distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}